

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O2

shared_ptr<const_unsigned_char> __thiscall
pstore::database::getro<unsigned_char,void>
          (database *this,typed_address<unsigned_char> addr,size_t elements)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_unsigned_char> sVar1;
  undefined1 local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  (**(code **)(*(long *)addr.a_.a_ + 0x10))(local_20);
  std::static_pointer_cast<unsigned_char_const,void_const>((shared_ptr<const_void> *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  sVar1.super___shared_ptr<const_unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_unsigned_char>)
         sVar1.super___shared_ptr<const_unsigned_char,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T const> getro (typed_address<T> const addr,
                                        std::size_t const elements) const {
            if (addr.to_address ().absolute () % alignof (T) != 0) {
                raise (error_code::bad_alignment);
            }
            return std::static_pointer_cast<T const> (
                this->getro (addr.to_address (), sizeof (T) * elements));
        }